

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  int iVar1;
  bool bVar2;
  uchar *puVar3;
  
  if ((this->buffer_used_ == this->buffer_size_) && (bVar2 = WriteBuffer(this), !bVar2)) {
    return false;
  }
  if (((this->buffer_).array_ == (uchar *)0x0) &&
     (puVar3 = (uchar *)operator_new__((long)this->buffer_size_), puVar3 != (uchar *)0x0)) {
    (this->buffer_).array_ = puVar3;
  }
  iVar1 = this->buffer_used_;
  *data = (this->buffer_).array_ + iVar1;
  *size = this->buffer_size_ - iVar1;
  this->buffer_used_ = this->buffer_size_;
  return true;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}